

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  int *piVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint64_t uVar11;
  uint16_t *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  void *pvVar25;
  byte bVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  char *pcVar30;
  ulong uVar31;
  short sVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  size_t *psVar44;
  ulong uVar45;
  ulong uVar46;
  size_t sVar47;
  long lVar48;
  size_t *psVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  ulong uStack_190;
  ulong local_188;
  ulong local_150;
  ulong local_138;
  ulong local_118;
  ulong local_100;
  ulong local_f0;
  ulong local_e8;
  size_t *local_e0;
  ulong local_d8;
  
  bVar26 = literal_context_lut[8];
  uVar5 = (position - 7) + num_bytes;
  sVar47 = position;
  if (7 < num_bytes) {
    sVar47 = uVar5;
  }
  lVar48 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar48 = 0x40;
  }
  lVar10 = *(long *)(literal_context_lut + 0x10);
  uVar41 = *(ulong *)dist_cache;
  uVar34 = *(uint *)&(params->dictionary).words;
  if (4 < (int)uVar34) {
    iVar18 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar18 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar18 + 1;
    (hasher->common).params.type = iVar18 + -2;
    (hasher->common).params.bucket_bits = iVar18 + 2;
    (hasher->common).params.block_bits = iVar18 + -3;
    (hasher->common).params.hash_len = iVar18 + 3;
    if (10 < uVar34) {
      iVar18 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar18 + -1;
      (hasher->common).is_prepared_ = iVar18 + 1;
      *(int *)&hasher->privat = iVar18 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar18 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar18 + 3,iVar18 + -3);
    }
  }
  uVar6 = (1L << (bVar26 & 0x3f)) - 0x10;
  uVar2 = position + num_bytes;
  uVar31 = lVar48 + position;
  lVar4 = position - 1;
  local_e0 = last_insert_len;
  auVar58 = _DAT_001360d0;
LAB_00105a5d:
LAB_00105a70:
  uVar46 = position;
  if (uVar2 <= uVar46 + 8) {
    *(ulong *)dist_cache = (uVar41 + uVar2) - uVar46;
    *(long *)commands = *(long *)commands + ((long)local_e0 - (long)last_insert_len >> 4);
    return;
  }
  local_118 = uVar2 - uVar46;
  uVar21 = uVar6;
  if (uVar46 < uVar6) {
    uVar21 = uVar46;
  }
  local_e8 = lVar10 + uVar46;
  if (uVar6 <= lVar10 + uVar46) {
    local_e8 = uVar6;
  }
  uVar27 = *(ulong *)(literal_context_lut + 0x50);
  uVar11 = (params->dictionary).cutoffTransforms;
  puVar12 = (params->dictionary).hash_table_words;
  uVar19 = uVar46 & ringbuffer_mask;
  psVar49 = *(size_t **)backward_references;
  psVar44 = num_literals + (long)psVar49 * 2;
  do {
    bVar57 = back_refs_position == (size_t *)0x0;
    if (back_refs_position <= psVar49) {
LAB_00105bb5:
      puVar3 = (ulong *)(ringbuffer + uVar19);
      uVar42 = (ulong)((uint)local_118 & 7);
      uVar20 = 0x7e4;
      uVar36 = 0;
      local_138 = 0;
      uVar52 = 0;
      uVar45 = 0;
      do {
        if (uVar52 == (long)*(int *)&(params->dictionary).words) {
          uVar52._0_4_ = (params->dist).alphabet_size_max;
          uVar52._4_4_ = (params->dist).alphabet_size_limit;
          uVar52 = (*puVar3 & uVar52) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(params->dist).distance_postfix_bits & 0x3f);
          uVar23 = uVar52 & 0xffffffff;
          uVar34 = (int)uVar52 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
          uVar7 = *(ushort *)(uVar11 + uVar23 * 2);
          uVar22 = (ulong)uVar7;
          piVar1 = &(params->hasher).num_last_distances_to_check;
          uVar52 = 0;
          if (*(ulong *)piVar1 <= uVar22) {
            uVar52 = uVar22 - *(long *)piVar1;
          }
          uVar33 = (uint)(params->dist).max_distance;
          do {
            uVar43 = uVar45;
            local_150 = uVar36;
            local_f0 = uVar20;
            uVar50 = local_138;
            uVar54 = uVar43 + uVar19;
            do {
              do {
                do {
                  do {
                    if (uVar22 <= uVar52) {
LAB_00105f7f:
                      *(int *)(puVar12 + (ulong)uVar34 * 2 + (ulong)(uVar33 & uVar7) * 2) =
                           (int)uVar46;
                      *(ushort *)(uVar11 + uVar23 * 2) = uVar7 + 1;
                      if (local_f0 != 0x7e4) {
                        iVar18 = 0;
                        bVar56 = true;
                        local_188 = uVar50;
                        goto LAB_00106241;
                      }
                      if (!bVar57) {
                        if (back_refs_position <= psVar49) goto LAB_00106369;
                        uVar20 = (ulong)(int)*psVar44;
                        goto LAB_00106273;
                      }
                      lVar35 = *(long *)&(params->dictionary).num_transforms;
                      uVar21 = *(ulong *)(lVar35 + 8);
                      local_188 = *(ulong *)(lVar35 + 0x10);
                      bVar57 = true;
                      if (local_188 < uVar21 >> 7) goto LAB_0010636b;
                      uVar19 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar13 = *(long *)(literal_context_lut + 0x78);
                      local_f0 = 0x7e4;
                      iVar18 = 0;
                      lVar51 = 0;
                      goto LAB_00106045;
                    }
                    uVar22 = uVar22 - 1;
                    uVar53 = *(uint *)(puVar12 +
                                      (ulong)uVar34 * 2 + (ulong)((uint)uVar22 & uVar33) * 2);
                    uVar36 = uVar46 - uVar53;
                    if (uVar21 < uVar36) goto LAB_00105f7f;
                  } while (ringbuffer_mask < uVar54);
                  uVar45 = (ulong)(uVar53 & (uint)ringbuffer_mask);
                  uVar20 = uVar45 + uVar43;
                } while ((ringbuffer_mask < uVar20) || (ringbuffer[uVar54] != ringbuffer[uVar20]));
                uVar20 = 0;
                lVar35 = 0;
LAB_00105e71:
                uVar28 = local_118 & 0xfffffffffffffff8;
                uVar55 = uVar42;
                if (local_118 >> 3 == uVar20) {
                  for (; (local_138 = local_118, uVar55 != 0 &&
                         (local_138 = uVar28,
                         ringbuffer[uVar28 + uVar45] == *(uint8_t *)((long)puVar3 + uVar28)));
                      uVar28 = uVar28 + 1) {
                    uVar55 = uVar55 - 1;
                  }
                }
                else {
                  if (puVar3[uVar20] == *(ulong *)(ringbuffer + uVar20 * 8 + uVar45))
                  goto code_r0x00105e8e;
                  uVar45 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar45) ^ puVar3[uVar20];
                  uVar20 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  local_138 = (uVar20 >> 3 & 0x1fffffff) - lVar35;
                }
                if ((psVar49 < back_refs_position) &&
                   ((ulong)(long)(int)*psVar44 < local_138 + uVar46)) {
                  local_138 = (long)(int)*psVar44 - uVar46;
                }
              } while (local_138 < 4);
              iVar18 = 0x1f;
              if ((uint)uVar36 != 0) {
                for (; (uint)uVar36 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                }
              }
              uVar20 = (ulong)(iVar18 * -0x1e + 0x780) + local_138 * 0x87;
              uVar45 = local_138;
            } while (uVar20 <= local_f0);
          } while( true );
        }
        uVar22 = (ulong)*(int *)((long)&(hasher->common).extra + uVar52 * 4);
        if (((uVar22 <= uVar21) && (uVar46 - uVar22 < uVar46)) &&
           (uVar45 + uVar19 <= ringbuffer_mask)) {
          uVar23 = uVar46 - uVar22 & ringbuffer_mask;
          if ((uVar23 + uVar45 <= ringbuffer_mask) &&
             (ringbuffer[uVar45 + uVar19] == ringbuffer[uVar23 + uVar45])) {
            uVar54 = 0;
            lVar35 = 0;
LAB_00105c6e:
            uVar50 = local_118 & 0xfffffffffffffff8;
            uVar43 = uVar42;
            if (local_118 >> 3 == uVar54) {
              for (; (uVar54 = local_118, uVar43 != 0 &&
                     (uVar54 = uVar50,
                     ringbuffer[uVar50 + uVar23] == *(uint8_t *)((long)puVar3 + uVar50)));
                  uVar50 = uVar50 + 1) {
                uVar43 = uVar43 - 1;
              }
            }
            else {
              if (puVar3[uVar54] == *(ulong *)(ringbuffer + uVar54 * 8 + uVar23))
              goto code_r0x00105c8b;
              uVar54 = *(ulong *)(ringbuffer + uVar54 * 8 + uVar23) ^ puVar3[uVar54];
              uVar23 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar54 = (uVar23 >> 3 & 0x1fffffff) - lVar35;
            }
            if ((psVar49 < back_refs_position) && ((ulong)(long)(int)*psVar44 < uVar54 + uVar46)) {
              uVar54 = (long)(int)*psVar44 - uVar46;
            }
            if (((2 < uVar54) || ((uVar52 < 2 && (uVar54 == 2)))) &&
               (uVar23 = uVar54 * 0x87 + 0x78f, uVar20 < uVar23)) {
              if (uVar52 != 0) {
                uVar23 = uVar23 - ((0x1ca10U >> ((byte)uVar52 & 0xe) & 0xe) + 0x27);
              }
              if (uVar20 < uVar23) {
                uVar20 = uVar23;
                uVar36 = uVar22;
                uVar45 = uVar54;
                local_138 = uVar54;
              }
            }
          }
        }
        uVar52 = uVar52 + 1;
      } while( true );
    }
    uVar20 = (ulong)(int)*psVar44;
    if (uVar46 <= uVar20) {
      if (uVar46 == uVar20) {
        uVar34 = (uint)psVar44[1];
        local_150 = (ulong)(int)uVar34;
        if ((uVar46 <= uVar46 - local_150) || (*(uint *)((long)psVar44 + 0xc) < uVar34))
        goto LAB_00106273;
        uVar27 = uVar46 - local_150 & ringbuffer_mask;
        uVar21 = local_118 & 0xfffffffffffffff8;
        uVar20 = 0;
        lVar35 = 0;
        break;
      }
      bVar57 = false;
      goto LAB_00105bb5;
    }
    psVar49 = (size_t *)((long)psVar49 + 1);
    *(size_t **)backward_references = psVar49;
    psVar44 = psVar44 + 2;
  } while( true );
LAB_00105b7c:
  if (local_118 >> 3 == uVar20) goto LAB_00106559;
  if (*(ulong *)(ringbuffer + uVar20 * 8 + uVar19) != *(ulong *)(ringbuffer + uVar20 * 8 + uVar27))
  {
    uVar27 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar27) ^
             *(ulong *)(ringbuffer + uVar20 * 8 + uVar19);
    uVar21 = 0;
    if (uVar27 != 0) {
      for (; (uVar27 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    uVar36 = (uVar21 >> 3 & 0x1fffffff) - lVar35;
    goto LAB_001064cc;
  }
  lVar35 = lVar35 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_00105b7c;
LAB_00106559:
  uVar20 = (ulong)((uint)local_118 & 7);
  for (; (bVar57 = uVar20 != 0, uVar20 = uVar20 - 1, uVar36 = local_118, bVar57 &&
         (uVar36 = uVar21, ringbuffer[uVar21 + uVar27] == ringbuffer[uVar21 + uVar19]));
      uVar21 = uVar21 + 1) {
  }
LAB_001064cc:
  local_188 = (long)*(int *)((long)psVar44 + 4);
  if (uVar36 < (ulong)(long)*(int *)((long)psVar44 + 4)) {
    local_188 = uVar36;
  }
  iVar18 = 0x1f;
  if (uVar34 != 0) {
    for (; uVar34 >> iVar18 == 0; iVar18 = iVar18 + -1) {
    }
  }
  local_f0 = (ulong)(iVar18 * -0x1e + 0x780) + local_188 * 0x87;
  bVar57 = false;
  bVar56 = false;
  iVar18 = 0;
LAB_00106241:
  if (0x7e4 < local_f0) goto LAB_00106593;
LAB_0010636b:
  uVar41 = uVar41 + 1;
  position = uVar46 + 1;
  if (bVar57 && uVar31 < position) {
    if ((uint)((int)lVar48 * 4) + uVar31 < position) {
      uVar21 = uVar46 + 0x11;
      if (uVar5 <= uVar46 + 0x11) {
        uVar21 = uVar5;
      }
      for (; position < uVar21; position = position + 4) {
        uVar19._0_4_ = (params->dist).alphabet_size_max;
        uVar19._4_4_ = (params->dist).alphabet_size_limit;
        uVar11 = (params->dictionary).cutoffTransforms;
        bVar26 = *(byte *)((long)&(params->dist).max_distance + 4);
        uVar46 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar19) *
                 0x1fe35a7bd3579bd3 >> ((byte)(params->dist).distance_postfix_bits & 0x3f);
        uVar27 = uVar46 & 0xffffffff;
        uVar7 = *(ushort *)(uVar11 + uVar27 * 2);
        sVar16 = (params->dist).max_distance;
        puVar12 = (params->dictionary).hash_table_words;
        *(ushort *)(uVar11 + uVar27 * 2) = uVar7 + 1;
        *(int *)(puVar12 +
                (ulong)((uint)sVar16 & (uint)uVar7) * 2 +
                (ulong)(uint)((int)uVar46 << (bVar26 & 0x1f)) * 2) = (int)position;
        uVar41 = uVar41 + 4;
      }
    }
    else {
      uVar21 = uVar46 + 9;
      if (uVar5 <= uVar46 + 9) {
        uVar21 = uVar5;
      }
      for (; position < uVar21; position = position + 2) {
        uVar27._0_4_ = (params->dist).alphabet_size_max;
        uVar27._4_4_ = (params->dist).alphabet_size_limit;
        uVar11 = (params->dictionary).cutoffTransforms;
        bVar26 = *(byte *)((long)&(params->dist).max_distance + 4);
        uVar46 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar27) *
                 0x1fe35a7bd3579bd3 >> ((byte)(params->dist).distance_postfix_bits & 0x3f);
        uVar27 = uVar46 & 0xffffffff;
        uVar7 = *(ushort *)(uVar11 + uVar27 * 2);
        sVar16 = (params->dist).max_distance;
        puVar12 = (params->dictionary).hash_table_words;
        *(ushort *)(uVar11 + uVar27 * 2) = uVar7 + 1;
        *(int *)(puVar12 +
                (ulong)((uint)sVar16 & (uint)uVar7) * 2 +
                (ulong)(uint)((int)uVar46 << (bVar26 & 0x1f)) * 2) = (int)position;
        uVar41 = uVar41 + 2;
      }
    }
  }
  goto LAB_00105a70;
LAB_00106045:
  if (lVar51 == 2) goto LAB_0010648d;
  uVar21 = uVar21 + 1;
  *(ulong *)(lVar35 + 8) = uVar21;
  bVar26 = *(byte *)(lVar13 + uVar19);
  uVar20 = (ulong)bVar26;
  if ((uVar20 != 0) && (uVar20 <= local_118)) {
    uVar42 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar19 * 2);
    lVar14 = *(long *)(literal_context_lut + 0x58);
    lVar29 = uVar42 * uVar20 + *(long *)(lVar14 + 0xa8) +
             (ulong)*(uint *)(lVar14 + 0x20 + uVar20 * 4);
    uVar45 = (ulong)(bVar26 & 0xfffffff8);
    uVar36 = 0;
LAB_001060c9:
    if (uVar45 == uVar36) {
      uVar52 = (ulong)(bVar26 & 7);
      pcVar30 = (char *)(lVar29 + uVar36);
      for (; (bVar57 = uVar52 != 0, uVar52 = uVar52 - 1, uVar36 = uVar20, bVar57 &&
             (uVar36 = uVar45, *(char *)((long)puVar3 + uVar45) == *pcVar30)); uVar45 = uVar45 + 1)
      {
        pcVar30 = pcVar30 + 1;
      }
    }
    else {
      uVar52 = *(ulong *)(lVar29 + uVar36);
      if (uVar52 == *(ulong *)((long)puVar3 + uVar36)) goto code_r0x001060e5;
      uVar52 = *(ulong *)((long)puVar3 + uVar36) ^ uVar52;
      uVar45 = 0;
      if (uVar52 != 0) {
        for (; (uVar52 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
        }
      }
      uVar36 = (uVar45 >> 3 & 0x1fffffff) + uVar36;
    }
    if (((uVar36 != 0) && (uVar20 < *(uint *)(literal_context_lut + 100) + uVar36)) &&
       (uVar20 = ((uVar20 - uVar36) * 4 +
                  (ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar20 - uVar36) * '\x06' & 0x3fU)) & 0x3f) <<
                 (*(byte *)(lVar14 + uVar20) & 0x3f)) + uVar42 + local_e8 + 1, uVar20 <= uVar27)) {
      iVar40 = 0x1f;
      if ((uint)uVar20 != 0) {
        for (; (uint)uVar20 >> iVar40 == 0; iVar40 = iVar40 + -1) {
        }
      }
      uVar45 = (uVar36 * 0x87 - (ulong)(uint)(iVar40 * 0x1e)) + 0x780;
      if (local_f0 <= uVar45) {
        iVar18 = (uint)bVar26 - (int)uVar36;
        local_188 = local_188 + 1;
        *(ulong *)(lVar35 + 0x10) = local_188;
        local_f0 = uVar45;
        local_150 = uVar20;
        uVar50 = uVar36;
      }
    }
  }
  lVar51 = lVar51 + 1;
  uVar19 = uVar19 + 1;
  goto LAB_00106045;
LAB_0010648d:
  bVar57 = true;
  bVar56 = true;
  local_188 = uVar50;
  goto LAB_00106241;
code_r0x001060e5:
  uVar36 = uVar36 + 8;
  goto LAB_001060c9;
LAB_00106273:
  if (uVar46 == uVar20) {
    uVar34 = (uint)psVar44[1];
    local_150 = (ulong)(int)uVar34;
    if (*(int *)((long)psVar44 + 0xc) < (int)uVar34) {
      uVar33 = *(uint *)((long)psVar44 + 4);
      uVar27 = (ulong)uVar33;
      if (uVar33 - 4 < 0x15 && (int)uVar34 < 0x7ffffffd) {
        uVar53 = ~(uint)uVar21 + uVar34;
        lVar35 = *(long *)(literal_context_lut + 0x58);
        iVar18 = (int)uVar53 >> (*(byte *)(lVar35 + uVar27) & 0x1f);
        if (iVar18 < *(int *)(literal_context_lut + 0x60)) {
          uVar9 = *(uint *)(lVar35 + 0x20 + uVar27 * 4);
          uVar8 = kBitMask[*(byte *)(lVar35 + uVar27)];
          lVar35 = *(long *)(lVar35 + 0xa8);
          uVar24 = BrotliGetTransforms();
          pvVar25 = malloc(uVar27 * 10);
          iVar18 = BrotliTransformDictionaryWord
                             (pvVar25,(ulong)uVar9 + lVar35 + (long)(int)((uVar53 & uVar8) * uVar33)
                              ,uVar27,uVar24,iVar18);
          local_188 = (ulong)iVar18;
          iVar40 = bcmp(ringbuffer + uVar19,pvVar25,local_188);
          auVar58 = _DAT_001360d0;
          if (iVar40 != 0) {
            bVar57 = false;
            goto LAB_0010636b;
          }
          iVar40 = 0x1f;
          if (uVar34 != 0) {
            for (; uVar34 >> iVar40 == 0; iVar40 = iVar40 + -1) {
            }
          }
          local_f0 = (ulong)(iVar40 * -0x1e + 0x780) + local_188 * 0x87;
          iVar18 = uVar33 - iVar18;
          bVar57 = false;
          bVar56 = false;
          goto LAB_00106241;
        }
      }
    }
  }
LAB_00106369:
  bVar57 = false;
  goto LAB_0010636b;
LAB_00106593:
  if (bVar56) {
    uVar11 = (params->dictionary).cutoffTransforms;
    puVar12 = (params->dictionary).hash_table_words;
    uVar20 = (lVar4 + num_bytes) - uVar46;
    uVar34 = 0;
    uVar31 = local_150;
    uVar21 = local_188;
    uVar27 = uVar41;
    uVar19 = uVar46;
    local_d8 = uVar20;
    iVar40 = iVar18;
    do {
      uVar45 = (ulong)((uint)uVar20 & 7);
      uVar36 = uVar20 >> 3;
      local_118 = local_118 - 1;
      uVar41 = uVar21 - 1;
      if (local_118 <= uVar21 - 1) {
        uVar41 = local_118;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar41 = 0;
      }
      uVar46 = uVar19 + 1;
      uVar42 = uVar6;
      if (uVar46 < uVar6) {
        uVar42 = uVar46;
      }
      local_e8 = lVar10 + uVar19 + 1;
      if (uVar6 <= local_e8) {
        local_e8 = uVar6;
      }
      uVar52 = *(ulong *)(literal_context_lut + 0x50);
      uVar22 = uVar46 & ringbuffer_mask;
      psVar49 = *(size_t **)backward_references;
      psVar44 = num_literals + (long)psVar49 * 2;
LAB_001066b1:
      if (back_refs_position <= psVar49) {
LAB_001066d6:
        puVar3 = (ulong *)(ringbuffer + uVar22);
        uVar23 = 0x7e4;
        uVar54 = 0;
        local_100 = 0;
        uVar50 = 0;
        do {
          if (uVar50 == (long)*(int *)&(params->dictionary).words) {
            uVar50._0_4_ = (params->dist).alphabet_size_max;
            uVar50._4_4_ = (params->dist).alphabet_size_limit;
            uVar50 = (*puVar3 & uVar50) * 0x1fe35a7bd3579bd3 >>
                     ((byte)(params->dist).distance_postfix_bits & 0x3f);
            uVar28 = uVar50 & 0xffffffff;
            uVar33 = (int)uVar50 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
            uVar7 = *(ushort *)(uVar11 + uVar28 * 2);
            uVar43 = (ulong)uVar7;
            piVar1 = &(params->hasher).num_last_distances_to_check;
            uVar50 = 0;
            if (*(ulong *)piVar1 <= uVar43) {
              uVar50 = uVar43 - *(long *)piVar1;
            }
            uVar53 = (uint)(params->dist).max_distance;
            do {
              local_150 = uVar54;
              local_188 = local_100;
              uVar38 = uVar41;
              uVar37 = uVar23;
              uVar55 = uVar38 + uVar22;
              do {
                do {
                  do {
                    do {
                      if (uVar43 <= uVar50) {
LAB_00106a83:
                        *(int *)(puVar12 + (ulong)uVar33 * 2 + (ulong)(uVar53 & uVar7) * 2) =
                             (int)uVar46;
                        *(ushort *)(uVar11 + uVar28 * 2) = uVar7 + 1;
                        iVar18 = 0;
                        if (uVar37 != 0x7e4) goto LAB_00106c07;
                        if (!bVar57) {
                          uVar37 = 0x7e4;
                          if (back_refs_position <= psVar49) goto LAB_00106c07;
                          goto LAB_00106bda;
                        }
                        lVar35 = *(long *)&(params->dictionary).num_transforms;
                        uVar41 = *(ulong *)(lVar35 + 8);
                        uVar36 = *(ulong *)(lVar35 + 0x10);
                        uVar37 = 0x7e4;
                        if (uVar36 < uVar41 >> 7) goto LAB_00106c07;
                        uVar45 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                        lVar13 = *(long *)(literal_context_lut + 0x78);
                        iVar18 = 0;
                        lVar51 = 0;
                        goto LAB_00106cd2;
                      }
                      uVar43 = uVar43 - 1;
                      uVar9 = *(uint *)(puVar12 +
                                       (ulong)uVar33 * 2 + (ulong)((uint)uVar43 & uVar53) * 2);
                      uVar54 = uVar46 - uVar9;
                      if (uVar42 < uVar54) goto LAB_00106a83;
                    } while (ringbuffer_mask < uVar55);
                    uVar23 = (ulong)(uVar9 & (uint)ringbuffer_mask);
                    uVar41 = uVar23 + uVar38;
                  } while ((ringbuffer_mask < uVar41) || (ringbuffer[uVar55] != ringbuffer[uVar41]))
                  ;
                  uVar41 = 0;
                  lVar35 = 0;
LAB_00106992:
                  if (uVar36 == uVar41) {
                    uVar39 = uVar45;
                    for (uVar41 = -lVar35;
                        (bVar56 = uVar39 != 0, uVar39 = uVar39 - 1, bVar56 &&
                        (ringbuffer[uVar41 + uVar23] == *(uint8_t *)((long)puVar3 + uVar41)));
                        uVar41 = uVar41 + 1) {
                    }
                  }
                  else {
                    if (puVar3[uVar41] == *(ulong *)(ringbuffer + uVar41 * 8 + uVar23))
                    goto code_r0x001069af;
                    uVar23 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar23) ^ puVar3[uVar41];
                    uVar41 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    uVar41 = (uVar41 >> 3 & 0x1fffffff) - lVar35;
                  }
                  if ((psVar49 < back_refs_position && !bVar57) &&
                     ((ulong)(long)(int)*psVar44 < uVar46 + uVar41)) {
                    uVar41 = (long)(int)*psVar44 - uVar46;
                  }
                } while (uVar41 < 4);
                iVar18 = 0x1f;
                if ((uint)uVar54 != 0) {
                  for (; (uint)uVar54 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                  }
                }
                uVar23 = (ulong)(iVar18 * -0x1e + 0x780) + uVar41 * 0x87;
                local_100 = uVar41;
              } while (uVar23 <= uVar37);
            } while( true );
          }
          uVar43 = (ulong)*(int *)((long)&(hasher->common).extra + uVar50 * 4);
          if (((uVar43 <= uVar42) && (uVar46 - uVar43 < uVar46)) &&
             (uVar22 + uVar41 <= ringbuffer_mask)) {
            uVar28 = uVar46 - uVar43 & ringbuffer_mask;
            if ((uVar28 + uVar41 <= ringbuffer_mask) &&
               (ringbuffer[uVar22 + uVar41] == ringbuffer[uVar28 + uVar41])) {
              uVar55 = 0;
              lVar35 = 0;
LAB_00106771:
              if (uVar36 == uVar55) {
                uVar37 = uVar45;
                for (uVar55 = -lVar35;
                    (bVar56 = uVar37 != 0, uVar37 = uVar37 - 1, bVar56 &&
                    (ringbuffer[uVar55 + uVar28] == *(uint8_t *)((long)puVar3 + uVar55)));
                    uVar55 = uVar55 + 1) {
                }
              }
              else {
                if (puVar3[uVar55] == *(ulong *)(ringbuffer + uVar55 * 8 + uVar28))
                goto code_r0x0010678e;
                uVar55 = *(ulong *)(ringbuffer + uVar55 * 8 + uVar28) ^ puVar3[uVar55];
                uVar28 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar55 = (uVar28 >> 3 & 0x1fffffff) - lVar35;
              }
              if ((psVar49 < back_refs_position && !bVar57) &&
                 ((ulong)(long)(int)*psVar44 < uVar55 + uVar46)) {
                uVar55 = (long)(int)*psVar44 - uVar46;
              }
              if (((2 < uVar55) || ((uVar50 < 2 && (uVar55 == 2)))) &&
                 (uVar28 = uVar55 * 0x87 + 0x78f, uVar23 < uVar28)) {
                if (uVar50 != 0) {
                  uVar28 = uVar28 - ((0x1ca10U >> ((byte)uVar50 & 0xe) & 0xe) + 0x27);
                }
                if (uVar23 < uVar28) {
                  uVar23 = uVar28;
                  uVar41 = uVar55;
                  uVar54 = uVar43;
                  local_100 = uVar55;
                }
              }
            }
          }
          uVar50 = uVar50 + 1;
        } while( true );
      }
      if ((ulong)(long)(int)*psVar44 < uVar46) {
        psVar49 = (size_t *)((long)psVar49 + 1);
        *(size_t **)backward_references = psVar49;
        psVar44 = psVar44 + 2;
        goto LAB_001066b1;
      }
      if (uVar46 != (long)(int)*psVar44 || bVar57) goto LAB_001066d6;
      local_150 = (ulong)(int)(uint)psVar44[1];
      if (uVar46 <= uVar46 - local_150) {
        local_188 = 0;
        local_150 = 0;
        goto LAB_00106bda;
      }
      if ((uint)psVar44[1] <= *(uint *)((long)psVar44 + 0xc)) {
        uVar41 = uVar46 - local_150 & ringbuffer_mask;
        uVar31 = 0;
        lVar35 = 0;
        goto LAB_00107023;
      }
      local_188 = 0;
      local_150 = 0;
LAB_00106bda:
      uVar37 = 0x7e4;
      iVar18 = 0;
      if (uVar46 == (long)(int)*psVar44) {
        iVar15 = (int)psVar44[1];
        if (*(int *)((long)psVar44 + 0xc) < iVar15) {
          uVar34 = *(uint *)((long)psVar44 + 4);
          uVar41 = (ulong)uVar34;
          if (uVar34 - 4 < 0x15 && iVar15 < 0x7ffffffd) {
            iVar18 = 0;
            uVar33 = ~(uint)uVar42 + iVar15;
            lVar35 = *(long *)(literal_context_lut + 0x58);
            iVar40 = (int)uVar33 >> (*(byte *)(lVar35 + uVar41) & 0x1f);
            if (iVar40 < *(int *)(literal_context_lut + 0x60)) {
              uVar53 = *(uint *)(lVar35 + 0x20 + uVar41 * 4);
              uVar9 = kBitMask[*(byte *)(lVar35 + uVar41)];
              lVar35 = *(long *)(lVar35 + 0xa8);
              uVar24 = BrotliGetTransforms();
              pvVar25 = malloc(uVar41 * 10);
              iVar40 = BrotliTransformDictionaryWord
                                 (pvVar25,(ulong)uVar53 + lVar35 +
                                          (long)(int)((uVar33 & uVar9) * uVar34),uVar41,uVar24,
                                  iVar40);
              iVar17 = bcmp(ringbuffer + uVar22,pvVar25,(long)iVar40);
              auVar58 = _DAT_001360d0;
              if (iVar17 == 0) {
                iVar18 = uVar34 - iVar40;
                local_188 = (long)iVar40;
                local_150 = (long)iVar15;
              }
              goto LAB_0010709c;
            }
          }
          iVar18 = 0;
          goto LAB_0010709c;
        }
        uVar37 = 0x7e4;
      }
LAB_00106c07:
      if (uVar37 < local_f0 + 0xaf) {
        local_188 = uVar21;
        local_150 = uVar31;
        uVar46 = uVar19;
        uVar41 = uVar27;
        iVar18 = iVar40;
        local_e8 = uVar19 + lVar10;
        if (uVar6 <= uVar19 + lVar10) {
          local_e8 = uVar6;
        }
        break;
      }
      uVar41 = uVar27 + 1;
      if (2 < uVar34) goto LAB_0010709c;
      uVar34 = uVar34 + 1;
      uVar36 = uVar19 + 9;
      uVar20 = uVar20 - 1;
      local_d8 = (ulong)(byte)((byte)local_d8 + 7);
      uVar31 = local_150;
      uVar21 = local_188;
      uVar27 = uVar41;
      uVar19 = uVar46;
      local_f0 = uVar37;
      iVar40 = iVar18;
    } while (uVar36 < uVar2);
  }
  goto LAB_001070a6;
LAB_00106cd2:
  if (lVar51 == 2) goto LAB_00106c07;
  uVar41 = uVar41 + 1;
  *(ulong *)(lVar35 + 8) = uVar41;
  bVar26 = *(byte *)(lVar13 + uVar45);
  uVar42 = (ulong)bVar26;
  if ((uVar42 != 0) && (uVar42 <= local_118)) {
    uVar54 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar45 * 2);
    lVar14 = *(long *)(literal_context_lut + 0x58);
    lVar29 = uVar54 * uVar42 + *(long *)(lVar14 + 0xa8) +
             (ulong)*(uint *)(lVar14 + 0x20 + uVar42 * 4);
    uVar23 = (ulong)(bVar26 & 0xfffffff8);
    uVar22 = 0;
LAB_00106d6b:
    if (uVar23 == uVar22) {
      uVar50 = (ulong)(bVar26 & 7);
      pcVar30 = (char *)(lVar29 + uVar22);
      for (; (bVar56 = uVar50 != 0, uVar50 = uVar50 - 1, uVar22 = uVar42, bVar56 &&
             (uVar22 = uVar23, *(char *)((long)puVar3 + uVar23) == *pcVar30)); uVar23 = uVar23 + 1)
      {
        pcVar30 = pcVar30 + 1;
      }
    }
    else {
      uVar50 = *(ulong *)(lVar29 + uVar22);
      if (uVar50 == *(ulong *)((long)puVar3 + uVar22)) goto code_r0x00106d87;
      uVar50 = *(ulong *)((long)puVar3 + uVar22) ^ uVar50;
      uVar23 = 0;
      if (uVar50 != 0) {
        for (; (uVar50 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      uVar22 = (uVar23 >> 3 & 0x1fffffff) + uVar22;
    }
    if (((uVar22 != 0) && (uVar42 < *(uint *)(literal_context_lut + 100) + uVar22)) &&
       (uVar42 = ((uVar42 - uVar22) * 4 +
                  (ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar42 - uVar22) * '\x06' & 0x3fU)) & 0x3f) <<
                 (*(byte *)(lVar14 + uVar42) & 0x3f)) + uVar54 + local_e8 + 1, uVar42 <= uVar52)) {
      iVar15 = 0x1f;
      if ((uint)uVar42 != 0) {
        for (; (uint)uVar42 >> iVar15 == 0; iVar15 = iVar15 + -1) {
        }
      }
      uVar23 = (uVar22 * 0x87 - (ulong)(uint)(iVar15 * 0x1e)) + 0x780;
      if (uVar37 <= uVar23) {
        iVar18 = (uint)bVar26 - (int)uVar22;
        uVar36 = uVar36 + 1;
        *(ulong *)(lVar35 + 0x10) = uVar36;
        uVar37 = uVar23;
        local_150 = uVar42;
        local_188 = uVar22;
      }
    }
  }
  lVar51 = lVar51 + 1;
  uVar45 = uVar45 + 1;
  goto LAB_00106cd2;
code_r0x00106d87:
  uVar22 = uVar22 + 8;
  goto LAB_00106d6b;
code_r0x001069af:
  lVar35 = lVar35 + -8;
  uVar41 = uVar41 + 1;
  goto LAB_00106992;
code_r0x0010678e:
  lVar35 = lVar35 + -8;
  uVar55 = uVar55 + 1;
  goto LAB_00106771;
LAB_00107023:
  if (uVar36 == uVar31) goto LAB_0010747e;
  if (*(ulong *)(ringbuffer + uVar31 * 8 + uVar22) != *(ulong *)(ringbuffer + uVar31 * 8 + uVar41))
  {
    uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar41) ^
             *(ulong *)(ringbuffer + uVar31 * 8 + uVar22);
    uVar41 = 0;
    if (uVar31 != 0) {
      for (; (uVar31 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
      }
    }
    uVar31 = (uVar41 >> 3 & 0x1fffffff) - lVar35;
    goto LAB_0010705b;
  }
  lVar35 = lVar35 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_00107023;
LAB_0010747e:
  uVar21 = (ulong)((byte)local_d8 & 7);
  for (uVar31 = -lVar35;
      (bVar57 = uVar21 != 0, uVar21 = uVar21 - 1, bVar57 &&
      (ringbuffer[uVar31 + uVar41] == ringbuffer[uVar31 + uVar22])); uVar31 = uVar31 + 1) {
  }
LAB_0010705b:
  local_188 = (long)*(int *)((long)psVar44 + 4);
  if (uVar31 < (ulong)(long)*(int *)((long)psVar44 + 4)) {
    local_188 = uVar31;
  }
  iVar18 = 0;
LAB_0010709c:
  uVar41 = uVar27 + 1;
LAB_001070a6:
  if (local_e8 < local_150) {
LAB_001070c0:
    uStack_190 = local_150 + 0xf;
  }
  else {
    uVar31 = (ulong)*(int *)&(hasher->common).extra;
    if (local_150 == uVar31) {
      uStack_190 = 0;
      goto LAB_00107156;
    }
    uVar21 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uStack_190 = 1;
    if (local_150 != uVar21) {
      uVar31 = (local_150 + 3) - uVar31;
      if (uVar31 < 7) {
        bVar26 = (byte)((int)uVar31 << 2);
        uVar34 = 0x9750468;
      }
      else {
        uVar21 = (local_150 + 3) - uVar21;
        if (6 < uVar21) {
          uStack_190 = 2;
          if ((local_150 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uStack_190 = 3,
             local_150 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
          goto LAB_001070c0;
          goto LAB_001070c4;
        }
        bVar26 = (byte)((int)uVar21 << 2);
        uVar34 = 0xfdb1ace;
      }
      uStack_190 = (ulong)(uVar34 >> (bVar26 & 0x1f) & 0xf);
    }
  }
LAB_001070c4:
  if ((local_150 <= local_e8) && (uStack_190 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    pvVar25 = (hasher->common).extra;
    *(void **)((long)&(hasher->common).extra + 4) = pvVar25;
    iVar40 = (int)local_150;
    *(int *)&(hasher->common).extra = iVar40;
    uVar34 = *(uint *)&(params->dictionary).words;
    if (4 < (int)uVar34) {
      *(int *)&(hasher->common).dict_num_matches = iVar40 + auVar58._0_4_;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar40 + auVar58._4_4_;
      (hasher->common).params.type = iVar40 + auVar58._8_4_;
      (hasher->common).params.bucket_bits = iVar40 + auVar58._12_4_;
      (hasher->common).params.block_bits = iVar40 + -3;
      (hasher->common).params.hash_len = iVar40 + 3;
      if (10 < uVar34) {
        iVar40 = (int)pvVar25;
        (hasher->common).params.num_last_distances_to_check = iVar40 + auVar58._0_4_;
        (hasher->common).is_prepared_ = iVar40 + auVar58._4_4_;
        *(int *)&hasher->privat = iVar40 + auVar58._8_4_;
        *(int *)((long)&hasher->privat + 4) = iVar40 + auVar58._12_4_;
        (hasher->privat)._H5.block_size_ = CONCAT44(iVar40 + 3,iVar40 + -3);
      }
    }
  }
LAB_00107156:
  uVar34 = (uint)uVar41;
  *(uint *)local_e0 = uVar34;
  *(uint *)((long)local_e0 + 4) = iVar18 << 0x19 | (uint)local_188;
  uVar31 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar33 = 0;
  if (uVar31 <= uStack_190) {
    bVar26 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar21 = ((4L << (bVar26 & 0x3f)) + (uStack_190 - *(uint *)(literal_context_lut + 0x44))) - 0x10
    ;
    uVar33 = 0x1f;
    uVar53 = (uint)uVar21;
    if (uVar53 != 0) {
      for (; uVar53 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (uVar33 ^ 0xffffffe0) + 0x1f;
    uVar27 = (ulong)((uVar21 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
    lVar35 = (ulong)uVar33 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uStack_190 = (~(-1 << (bVar26 & 0x1f)) & uVar53) + uVar31 +
                 (uVar27 + lVar35 * 2 + 0xfffe << (bVar26 & 0x3f)) | lVar35 * 0x400;
    uVar33 = (uint)(uVar21 - (uVar27 + 2 << ((byte)uVar33 & 0x3f)) >> (bVar26 & 0x3f));
  }
  *(short *)((long)local_e0 + 0xe) = (short)uStack_190;
  *(uint *)(local_e0 + 1) = uVar33;
  if (5 < uVar41) {
    if (uVar41 < 0x82) {
      uVar34 = 0x1f;
      uVar33 = (uint)(uVar41 - 2);
      if (uVar33 != 0) {
        for (; uVar33 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar34 = (int)(uVar41 - 2 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar34 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar41 < 0x842) {
      uVar33 = 0x1f;
      if (uVar34 - 0x42 != 0) {
        for (; uVar34 - 0x42 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar34 = (uVar33 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar34 = 0x15;
      if (0x1841 < uVar41) {
        uVar34 = (uint)(ushort)(0x17 - (uVar41 < 0x5842));
      }
    }
  }
  uVar33 = iVar18 + (uint)local_188;
  if (uVar33 < 10) {
    uVar53 = uVar33 - 2;
  }
  else if (uVar33 < 0x86) {
    uVar33 = uVar33 - 6;
    uVar53 = 0x1f;
    if (uVar33 != 0) {
      for (; uVar33 >> uVar53 == 0; uVar53 = uVar53 - 1) {
      }
    }
    uVar53 = (uVar33 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar53 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar53 = 0x17;
    if (uVar33 < 0x846) {
      uVar53 = 0x1f;
      if (uVar33 - 0x46 != 0) {
        for (; uVar33 - 0x46 >> uVar53 == 0; uVar53 = uVar53 - 1) {
        }
      }
      uVar53 = (uVar53 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar53;
  sVar32 = (uVar7 & 7) + ((ushort)uVar34 & 7) * 8;
  if ((((uStack_190 & 0x3ff) == 0) && ((ushort)uVar34 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      sVar32 = sVar32 + 0x40;
    }
  }
  else {
    iVar18 = ((uVar34 & 0xffff) >> 3) * 3 + ((uVar53 & 0xffff) >> 3);
    sVar32 = sVar32 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  *(short *)((long)local_e0 + 0xc) = sVar32;
  *num_commands = *num_commands + uVar41;
  position = uVar46 + local_188;
  uVar41 = sVar47;
  if (position < sVar47) {
    uVar41 = position;
  }
  uVar21 = uVar46 + 2;
  if (local_150 < local_188 >> 2) {
    uVar31 = position + local_150 * -4;
    if (uVar31 < uVar21) {
      uVar31 = uVar21;
    }
    uVar21 = uVar31;
    if (uVar41 < uVar31) {
      uVar21 = uVar41;
    }
  }
  uVar31 = lVar48 + local_188 * 2 + uVar46;
  local_e0 = local_e0 + 2;
  for (; uVar21 < uVar41; uVar21 = uVar21 + 1) {
    uVar11 = (params->dictionary).cutoffTransforms;
    uVar46._0_4_ = (params->dist).alphabet_size_max;
    uVar46._4_4_ = (params->dist).alphabet_size_limit;
    uVar46 = (*(ulong *)(ringbuffer + (uVar21 & ringbuffer_mask)) & uVar46) * 0x1fe35a7bd3579bd3 >>
             ((byte)(params->dist).distance_postfix_bits & 0x3f);
    bVar26 = *(byte *)((long)&(params->dist).max_distance + 4);
    uVar27 = uVar46 & 0xffffffff;
    uVar7 = *(ushort *)(uVar11 + uVar27 * 2);
    sVar16 = (params->dist).max_distance;
    puVar12 = (params->dictionary).hash_table_words;
    *(ushort *)(uVar11 + uVar27 * 2) = uVar7 + 1;
    *(int *)(puVar12 +
            (ulong)((uint)sVar16 & (uint)uVar7) * 2 +
            (ulong)(uint)((int)uVar46 << (bVar26 & 0x1f)) * 2) = (int)uVar21;
  }
  uVar41 = 0;
  goto LAB_00105a5d;
code_r0x00105e8e:
  lVar35 = lVar35 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_00105e71;
code_r0x00105c8b:
  lVar35 = lVar35 + -8;
  uVar54 = uVar54 + 1;
  goto LAB_00105c6e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}